

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# B3DImporter.cpp
# Opt level: O1

bool __thiscall
Assimp::B3DImporter::CanRead(B3DImporter *this,string *pFile,IOSystem *param_2,bool param_3)

{
  long lVar1;
  bool bVar2;
  string ext;
  byte *local_30;
  long local_28;
  long local_20 [2];
  
  lVar1 = std::__cxx11::string::rfind((char)pFile,0x2e);
  if (lVar1 == -1) {
    bVar2 = false;
  }
  else {
    std::__cxx11::string::substr((ulong)&local_30,(ulong)pFile);
    if (((local_28 == 3) && ((*local_30 | 0x20) == 0x62)) && (local_30[1] == 0x33)) {
      bVar2 = (local_30[2] & 0xdf) == 0x44;
    }
    else {
      bVar2 = false;
    }
    if (local_30 != (byte *)local_20) {
      operator_delete(local_30,local_20[0] + 1);
    }
  }
  return bVar2;
}

Assistant:

bool B3DImporter::CanRead( const std::string& pFile, IOSystem* /*pIOHandler*/, bool /*checkSig*/) const{

    size_t pos=pFile.find_last_of( '.' );
    if( pos==string::npos ) return false;

    string ext=pFile.substr( pos+1 );
    if( ext.size()!=3 ) return false;

    return (ext[0]=='b' || ext[0]=='B') && (ext[1]=='3') && (ext[2]=='d' || ext[2]=='D');
}